

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::ArrayWithPreallocation<soul::Value,_8UL>::push_back
          (ArrayWithPreallocation<soul::Value,_8UL> *this,Value *item)

{
  Value *pVVar1;
  Category CVar2;
  bool bVar3;
  bool bVar4;
  BoundedIntSize BVar5;
  
  reserve(this,this->numActive + 1);
  CVar2 = (item->type).arrayElementCategory;
  bVar3 = (item->type).isRef;
  bVar4 = (item->type).isConstant;
  pVVar1 = this->items + this->numActive;
  (pVVar1->type).category = (item->type).category;
  (pVVar1->type).arrayElementCategory = CVar2;
  (pVVar1->type).isRef = bVar3;
  (pVVar1->type).isConstant = bVar4;
  (pVVar1->type).primitiveType.type = (item->type).primitiveType.type;
  BVar5 = (item->type).arrayElementBoundingSize;
  (pVVar1->type).boundingSize = (item->type).boundingSize;
  (pVVar1->type).arrayElementBoundingSize = BVar5;
  (pVVar1->type).structure.object = (item->type).structure.object;
  (item->type).structure.object = (Structure *)0x0;
  (pVVar1->allocatedData).allocatedSize = (item->allocatedData).allocatedSize;
  ArrayWithPreallocation<unsigned_char,_8UL>::ArrayWithPreallocation
            (&(pVVar1->allocatedData).allocatedData,&(item->allocatedData).allocatedData);
  this->numActive = this->numActive + 1;
  return;
}

Assistant:

void push_back (Item&& item)                            { reserve (numActive + 1); new (items + numActive) Item (std::move (item)); ++numActive; }